

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int setElementTypePrefix(XML_Parser parser,ELEMENT_TYPE *elementType)

{
  XML_Char XVar1;
  DTD *pDVar2;
  XML_Char *pXVar3;
  KEY pXVar4;
  XML_Bool XVar5;
  PREFIX *pPVar6;
  long lVar7;
  XML_Char *s;
  XML_Char *pXVar8;
  
  pDVar2 = parser->m_dtd;
  pXVar8 = elementType->name;
  lVar7 = 0;
  while( true ) {
    if (pXVar8[lVar7] == '\0') {
      return 1;
    }
    if (pXVar8[lVar7] == ':') break;
    lVar7 = lVar7 + 1;
  }
  if (lVar7 != 0) {
    do {
      if (((pDVar2->pool).ptr == (pDVar2->pool).end) &&
         (XVar5 = poolGrow(&pDVar2->pool), XVar5 == '\0')) {
        return 0;
      }
      XVar1 = *pXVar8;
      pXVar3 = (pDVar2->pool).ptr;
      (pDVar2->pool).ptr = pXVar3 + 1;
      *pXVar3 = XVar1;
      pXVar8 = pXVar8 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  if (((pDVar2->pool).ptr != (pDVar2->pool).end) || (XVar5 = poolGrow(&pDVar2->pool), XVar5 != '\0')
     ) {
    pXVar8 = (pDVar2->pool).ptr;
    (pDVar2->pool).ptr = pXVar8 + 1;
    *pXVar8 = '\0';
    pPVar6 = (PREFIX *)lookup(parser,&pDVar2->prefixes,(pDVar2->pool).start,0x10);
    if (pPVar6 != (PREFIX *)0x0) {
      pXVar4 = (pDVar2->pool).start;
      if (pPVar6->name == pXVar4) {
        (pDVar2->pool).start = (pDVar2->pool).ptr;
      }
      else {
        (pDVar2->pool).ptr = pXVar4;
      }
      elementType->prefix = pPVar6;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
setElementTypePrefix(XML_Parser parser, ELEMENT_TYPE *elementType) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  const XML_Char *name;
  for (name = elementType->name; *name; name++) {
    if (*name == XML_T(ASCII_COLON)) {
      PREFIX *prefix;
      const XML_Char *s;
      for (s = elementType->name; s != name; s++) {
        if (! poolAppendChar(&dtd->pool, *s))
          return 0;
      }
      if (! poolAppendChar(&dtd->pool, XML_T('\0')))
        return 0;
      prefix = (PREFIX *)lookup(parser, &dtd->prefixes, poolStart(&dtd->pool),
                                sizeof(PREFIX));
      if (! prefix)
        return 0;
      if (prefix->name == poolStart(&dtd->pool))
        poolFinish(&dtd->pool);
      else
        poolDiscard(&dtd->pool);
      elementType->prefix = prefix;
      break;
    }
  }
  return 1;
}